

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O0

void allphone_clear_segments(allphone_search_t *allphs)

{
  glist_t local_18;
  gnode_t *gn;
  allphone_search_t *allphs_local;
  
  for (local_18 = allphs->segments; local_18 != (glist_t)0x0; local_18 = local_18->next) {
    ckd_free((local_18->data).ptr);
  }
  glist_free(allphs->segments);
  allphs->segments = (glist_t)0x0;
  return;
}

Assistant:

static void
allphone_clear_segments(allphone_search_t * allphs)
{	
    gnode_t *gn;
    for (gn = allphs->segments; gn; gn = gn->next) {
        ckd_free(gnode_ptr(gn));
    }
    glist_free(allphs->segments);
    allphs->segments = NULL;
}